

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::WriteUnusedVarNames
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this,
          string *namebase)

{
  int iVar1;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,namebase,".unv");
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(mp::StringFileWriter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/mp/nl-writer2.hpp:220:27)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(mp::StringFileWriter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/mp/nl-writer2.hpp:220:27)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  iVar1 = WriteStringVec2File(this,&local_30,(function<void_(mp::StringFileWriter_&)> *)&local_50);
  this->maxLen_UnvName_ = iVar1;
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void NLWriter2<Params>::WriteUnusedVarNames(
    const std::string& namebase) {
  maxLen_UnvName_ =
      WriteStringVec2File(namebase + ".unv",
                          [this](StringFileWriter& w){
      feeder_.FeedUnusedVarNames(w);
});
}